

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O3

int __thiscall DNSResolve::AddToLoop(DNSResolve *this,EventLoop *event_loop)

{
  int s;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  if (this->event_loop_ == (EventLoop *)0x0) {
    if (this->is_closed_ != true) {
      s = socket(2,2,0x11);
      this->dns_socket_ = s;
      SetNoBlocking(s);
      this->event_loop_ = event_loop;
      EventLoop::Add(event_loop,this->dns_socket_,1,&this->super_ISockNotify);
      return 0;
    }
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_30,local_28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [error] ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"already closed\n",0xf)
    ;
  }
  else {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_30,local_28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [error] ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"already add to loop\n",0x14);
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return -1;
}

Assistant:

int DNSResolve::AddToLoop(EventLoop * event_loop)
{
    if (event_loop_)
    {
        LOGE << "already add to loop\n";
        return -1;
    }
    if (is_closed_)
    {
        LOGE << "already closed\n";
        return -1;
    }
    dns_socket_ = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
    SetNoBlocking(dns_socket_);
    event_loop_ = event_loop;
    event_loop_->Add(dns_socket_, kPollIn, this);
    return 0;
}